

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O0

CURLcode ftp_pl_insert_finfo(connectdata *conn,curl_fileinfo *finfo)

{
  SessionHandle *pSVar1;
  long *plVar2;
  curl_llist *list;
  long lVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *str;
  _Bool add;
  ftp_parselist_data *parser;
  curl_llist *llist;
  ftp_wc_tmpdata *tmpdata;
  WildcardData *wc;
  curl_fnmatch_callback compare;
  curl_fileinfo *finfo_local;
  connectdata *conn_local;
  
  pSVar1 = conn->data;
  plVar2 = (long *)(pSVar1->wildcard).tmp;
  list = (pSVar1->wildcard).filelist;
  lVar3 = *plVar2;
  bVar4 = true;
  local_78 = finfo->b_data;
  finfo->filename = local_78 + *(long *)(lVar3 + 0x28);
  if (*(long *)(lVar3 + 0x38) == 0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = local_78 + *(long *)(lVar3 + 0x38);
  }
  (finfo->strings).group = local_60;
  if (*(long *)(lVar3 + 0x48) == 0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = local_78 + *(long *)(lVar3 + 0x48);
  }
  (finfo->strings).perm = local_68;
  if (*(long *)(lVar3 + 0x50) == 0) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = local_78 + *(long *)(lVar3 + 0x50);
  }
  (finfo->strings).target = local_70;
  (finfo->strings).time = local_78 + *(long *)(lVar3 + 0x40);
  if (*(long *)(lVar3 + 0x30) == 0) {
    local_78 = (char *)0x0;
  }
  else {
    local_78 = local_78 + *(long *)(lVar3 + 0x30);
  }
  (finfo->strings).user = local_78;
  wc = (WildcardData *)(conn->data->set).fnmatch;
  if (wc == (WildcardData *)0x0) {
    wc = (WildcardData *)Curl_fnmatch;
  }
  iVar5 = (*(code *)wc)((conn->data->set).fnmatch_data,(pSVar1->wildcard).pattern,finfo->filename);
  if (iVar5 == 0) {
    if (((finfo->filetype == CURLFILETYPE_SYMLINK) && ((finfo->strings).target != (char *)0x0)) &&
       (pcVar6 = strstr((finfo->strings).target," -> "), pcVar6 != (char *)0x0)) {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4) {
    iVar5 = Curl_llist_insert_next(list,list->tail,finfo);
    if (iVar5 == 0) {
      Curl_fileinfo_dtor((void *)0x0,finfo);
      *(undefined8 *)(*plVar2 + 0x10) = 0;
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    Curl_fileinfo_dtor((void *)0x0,finfo);
  }
  *(undefined8 *)(*plVar2 + 0x10) = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct connectdata *conn,
                                    struct curl_fileinfo *finfo)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = &conn->data->wildcard;
  struct ftp_wc_tmpdata *tmpdata = wc->tmp;
  struct curl_llist *llist = wc->filelist;
  struct ftp_parselist_data *parser = tmpdata->parser;
  bool add = TRUE;

  /* move finfo pointers to b_data */
  char *str = finfo->b_data;
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = conn->data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  if(compare(conn->data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }

  if(add) {
    if(!Curl_llist_insert_next(llist, llist->tail, finfo)) {
      Curl_fileinfo_dtor(NULL, finfo);
      tmpdata->parser->file_data = NULL;
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    Curl_fileinfo_dtor(NULL, finfo);
  }

  tmpdata->parser->file_data = NULL;
  return CURLE_OK;
}